

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O2

void Abc_NtkCutsAddFanunt(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pAVar3;
  uint uVar4;
  int i;
  Abc_Obj_t *pFan0;
  Abc_Obj_t *pFan1;
  byte local_40;
  undefined7 uStack_3f;
  Abc_Obj_t *local_38;
  
  uVar4 = 0;
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pNode = Abc_NtkObj(pNtk,i);
    if (pNode != (Abc_Obj_t *)0x0) {
      iVar2 = Abc_NodeIsMuxType(pNode);
      if (iVar2 != 0) {
        pAVar3 = Abc_NodeRecognizeMux(pNode,&local_38,(Abc_Obj_t **)&local_40);
        local_40 = local_40 & 0xfe;
        piVar1 = (int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x2c);
        *piVar1 = *piVar1 + 1;
        iVar2 = Abc_NodeIsExorType(pNode);
        if (iVar2 == 0) {
          uVar4 = uVar4 + 1;
        }
        else {
          piVar1 = (int *)(CONCAT71(uStack_3f,local_40) + 0x2c);
          *piVar1 = *piVar1 + 1;
          uVar4 = uVar4 + 2;
        }
      }
    }
  }
  printf("Added %d fanouts\n",(ulong)uVar4);
  return;
}

Assistant:

void Abc_NtkCutsAddFanunt( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsMuxType(pObj) )
            continue;
        pFanC = Abc_NodeRecognizeMux( pObj, &pFan1, &pFan0 );
        pFanC = Abc_ObjRegular(pFanC);
        pFan0 = Abc_ObjRegular(pFan0);
        pFanC->vFanouts.nSize++;
        Counter++;
        if ( Abc_NodeIsExorType(pObj) )
        {
            pFan0->vFanouts.nSize++;
            Counter++;
        }
    }
    printf("Added %d fanouts\n", Counter );
}